

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O1

bool cmExportCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  char *__s;
  cmMakefile *pcVar2;
  pointer pcVar3;
  cmGlobalGenerator *pcVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  TargetType TVar9;
  PolicyStatus PVar10;
  undefined8 *puVar11;
  ostream *poVar12;
  string *psVar13;
  cmTarget *this;
  cmExportBuildFileGenerator *pcVar14;
  iterator iVar15;
  cmExportSet *exportSet;
  size_t sVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  PolicyID id;
  string *ct;
  undefined8 config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar18;
  cmGlobalGenerator *pcVar19;
  ulong uVar20;
  _Rb_tree_header *p_Var21;
  undefined8 uVar22;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  static_string_view name_06;
  string fname_1;
  string fname;
  string package;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  Arguments arguments;
  cmArgumentParser<Arguments> parser;
  undefined1 local_5e8 [48];
  cmGlobalGenerator *local_5b8;
  string local_5b0;
  string local_590;
  _Alloc_hider local_570;
  string local_568;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_548;
  _Any_data local_528;
  undefined1 local_518 [16];
  uint local_508 [2];
  code *pcStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  _Any_data local_4e8;
  code *local_4d8;
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  vStack_4d0;
  ios_base local_4b8 [512];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  undefined1 local_298 [32];
  _Storage<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false>
  local_278;
  bool local_260;
  _Alloc_hider local_258;
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  _Alloc_hider local_218;
  cmGlobalGenerator *local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  _Alloc_hider local_1f8;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  undefined2 local_1d8;
  long *local_120 [2];
  long local_110 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  code *local_d8;
  _Any_data local_c8;
  code *local_b8;
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  local_a8 [3];
  undefined8 local_50;
  void *local_40;
  undefined4 local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    local_528._M_unused._M_object = local_518;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_528,"called with too few arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((undefined1 *)local_528._M_unused._0_8_ != local_518) {
      operator_delete(local_528._M_unused._M_object,(ulong)(local_518._0_8_ + 1));
    }
    return false;
  }
  iVar8 = std::__cxx11::string::compare((char *)pbVar1);
  if (iVar8 == 0) {
    paVar17 = &local_590.field_2;
    local_590._M_string_length = 0;
    local_590.field_2._M_local_buf[0] = '\0';
    local_590._M_dataplus._M_p = (pointer)paVar17;
    if (0x20 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)) {
      uVar20 = 1;
      do {
        if (uVar20 == 2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528._M_pod_data);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_528,"PACKAGE given unknown argument: ",0x20);
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_528,pbVar1[2]._M_dataplus._M_p,pbVar1[2]._M_string_length);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_assign((string *)&status->Error);
          if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
            operator_delete((void *)local_298._0_8_,CONCAT71(local_298._17_7_,local_298[0x10]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528._M_pod_data);
          std::ios_base::~ios_base(local_4b8);
          goto LAB_00349937;
        }
        std::__cxx11::string::_M_assign((string *)&local_590);
        uVar20 = uVar20 + 1;
      } while (uVar20 < (ulong)((long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    if (local_590._M_string_length == 0) {
      local_298._0_8_ = (pointer)0x25;
      local_528._M_unused._M_object = local_518;
      local_528._M_unused._0_8_ =
           (undefined8)
           std::__cxx11::string::_M_create((ulong *)local_528._M_pod_data,(ulong)local_298);
      local_518._0_8_ = local_298._0_8_;
      *(undefined8 *)((long)local_528._M_unused._0_8_ + 0x10) = 0x2061206e65766967;
      *(undefined8 *)((long)local_528._M_unused._0_8_ + 0x18) = 0x206567616b636170;
      *(undefined8 *)local_528._M_unused._0_8_ = 0x204547414b434150;
      *(undefined8 *)((long)local_528._M_unused._0_8_ + 8) = 0x206562207473756d;
      *(undefined8 *)((long)local_528._M_unused._0_8_ + 0x1d) = 0x2e656d616e206567;
      local_528._8_8_ = local_298._0_8_;
      *(char *)(local_298._0_8_ + (long)local_528._M_unused._0_8_) = '\0';
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((undefined1 *)local_528._M_unused._0_8_ != local_518) {
        operator_delete(local_528._M_unused._M_object,(ulong)(local_518._0_8_ + 1));
      }
LAB_00349937:
      bVar6 = false;
      goto LAB_0034a733;
    }
    local_50 = 0;
    local_40 = (void *)0x0;
    local_38 = 0;
    memset(&local_100,0,0xaa);
    cmsys::RegularExpression::compile((RegularExpression *)&local_100,"^[A-Za-z0-9_.-]+$");
    bVar6 = cmsys::RegularExpression::find
                      ((RegularExpression *)&local_100,local_590._M_dataplus._M_p,
                       (RegularExpressionMatch *)&local_100);
    if (bVar6) {
      pcVar2 = status->Makefile;
      PVar10 = cmMakefile::GetPolicyStatus(pcVar2,CMP0090,false);
      if (PVar10 - NEW < 3) {
        local_298._0_8_ = (pointer)0x1d;
        local_528._M_unused._M_object = local_518;
        local_528._M_unused._0_8_ =
             (undefined8)
             std::__cxx11::string::_M_create((ulong *)local_528._M_pod_data,(ulong)local_298);
        local_518._0_8_ = local_298._0_8_;
        *(undefined8 *)((long)local_528._M_unused._0_8_ + 0xd) = 0x5f4547414b434150;
        *(undefined8 *)((long)local_528._M_unused._0_8_ + 0x15) = 0x5952545349474552;
        *(undefined8 *)local_528._M_unused._0_8_ = 0x58455f454b414d43;
        *(undefined8 *)((long)local_528._M_unused._0_8_ + 8) = 0x4341505f54524f50;
        local_528._8_8_ = local_298._0_8_;
        *(char *)(local_298._0_8_ + (long)local_528._M_unused._0_8_) = '\0';
        bVar7 = cmMakefile::IsOn(pcVar2,(string *)&local_528);
        if ((undefined1 *)local_528._M_unused._0_8_ != local_518) {
          operator_delete(local_528._M_unused._M_object,(ulong)(local_518._0_8_ + 1));
        }
        if (!bVar7) goto LAB_0034a721;
      }
      else if (PVar10 < NEW) {
        local_528._M_unused._M_object = local_518;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_528,"CMAKE_EXPORT_NO_PACKAGE_REGISTRY","");
        bVar7 = cmMakefile::IsOn(pcVar2,(string *)&local_528);
        if ((undefined1 *)local_528._M_unused._0_8_ != local_518) {
          operator_delete(local_528._M_unused._M_object,(ulong)(local_518._0_8_ + 1));
        }
        if (bVar7) goto LAB_0034a721;
      }
      psVar13 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar2);
      cmSystemTools::ComputeStringMD5(&local_568,psVar13);
      __s = (psVar13->_M_dataplus)._M_p;
      local_5e8._8_8_ = (char *)0x0;
      local_5e8[0x10] = '\0';
      local_5e8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_5e8 + 0x10);
      bVar7 = cmsys::SystemTools::GetEnv("HOME",(string *)local_5e8);
      if (bVar7) {
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_5e8);
        std::__cxx11::string::append(local_5e8);
        std::__cxx11::string::_M_append(local_5e8,(ulong)local_590._M_dataplus._M_p);
        cmsys::SystemTools::MakeDirectory((string *)local_5e8,(mode_t *)0x0);
        std::__cxx11::string::append(local_5e8);
        std::__cxx11::string::append(local_5e8);
        bVar7 = cmsys::SystemTools::FileExists((string *)local_5e8);
        if (!bVar7) {
          cmGeneratedFileStream::cmGeneratedFileStream
                    ((cmGeneratedFileStream *)&local_528,(string *)local_5e8,true,None);
          if ((*(uint *)(local_518 +
                        *(long *)(local_528._M_unused._M_function_pointer + -0x18) + 0x10) & 5) == 0
             ) {
            if (__s == (char *)0x0) {
              std::ios::clear((int)local_5e8 +
                              (int)*(long *)(local_528._M_unused._M_function_pointer + -0x18) + 0xc0
                             );
            }
            else {
              sVar16 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_528,__s,sVar16);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_528,"\n",1);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_298,"Cannot create package registry file:\n",0x25);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  ",2);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_298,(char *)local_5e8._0_8_,local_5e8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
            cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,local_5b0._M_dataplus._M_p,local_5b0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
              operator_delete(local_5b0._M_dataplus._M_p,
                              CONCAT71(local_5b0.field_2._M_allocated_capacity._1_7_,
                                       local_5b0.field_2._M_local_buf[0]) + 1);
            }
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar2,WARNING,&local_5b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
              operator_delete(local_5b0._M_dataplus._M_p,
                              CONCAT71(local_5b0.field_2._M_allocated_capacity._1_7_,
                                       local_5b0.field_2._M_local_buf[0]) + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
            std::ios_base::~ios_base((ios_base *)(local_238 + 0x10));
          }
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&local_528);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_5e8 + 0x10)) {
        operator_delete((void *)local_5e8._0_8_,CONCAT71(local_5e8._17_7_,local_5e8[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_568._M_dataplus._M_p != &local_568.field_2) {
        operator_delete(local_568._M_dataplus._M_p,local_568.field_2._0_8_ + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528._M_pod_data);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_528,"PACKAGE given invalid package name \"",0x24);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_528,local_590._M_dataplus._M_p,
                           local_590._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\".  ",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Package names must match \"",0x1a)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"^[A-Za-z0-9_.-]+$",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\".",2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
        operator_delete((void *)local_298._0_8_,CONCAT71(local_298._17_7_,local_298[0x10]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528._M_pod_data);
      std::ios_base::~ios_base(local_4b8);
    }
LAB_0034a721:
    if (local_40 != (void *)0x0) {
      operator_delete__(local_40);
    }
LAB_0034a733:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p == paVar17) {
      return bVar6;
    }
    operator_delete(local_590._M_dataplus._M_p,
                    CONCAT71(local_590.field_2._M_allocated_capacity._1_7_,
                             local_590.field_2._M_local_buf[0]) + 1);
    return bVar6;
  }
  vStack_4d0.
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_4d0.
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4d8 = (code *)0x0;
  vStack_4d0.
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4e8._0_8_ = 0;
  local_4e8._8_8_ = (code *)0x0;
  local_4f8 = 0;
  uStack_4f0 = 0;
  local_508[0] = 0;
  local_508[1] = 0;
  pcStack_500 = (code *)0x0;
  local_518._0_8_ = 0;
  local_518._8_8_ = 0;
  local_528._M_unused._M_object = (void *)0x0;
  local_528._8_8_ = 0;
  name.super_string_view._M_str = "NAMESPACE";
  name.super_string_view._M_len = 9;
  cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)local_528._M_pod_data,name,0x40);
  name_00.super_string_view._M_str = "FILE";
  name_00.super_string_view._M_len = 4;
  cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)local_528._M_pod_data,name_00,0x60);
  ArgumentParser::ActionMap::ActionMap((ActionMap *)&local_100,(ActionMap *)&local_528);
  std::
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::~vector(&vStack_4d0);
  if ((code *)local_4e8._8_8_ != (code *)0x0) {
    (*(code *)local_4e8._8_8_)(local_518 + 0x28,local_518 + 0x28,3);
  }
  if (pcStack_500 != (code *)0x0) {
    (*pcStack_500)(local_518 + 8,local_518 + 8,3);
  }
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             *)&local_528);
  bVar6 = cmExperimental::HasSupportEnabled(status->Makefile,CxxModuleCMakeApi);
  if (bVar6) {
    name_01.super_string_view._M_str = "CXX_MODULES_DIRECTORY";
    name_01.super_string_view._M_len = 0x15;
    cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_100._M_local_buf,name_01,0xa0);
  }
  iVar8 = std::__cxx11::string::compare
                    ((char *)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
  if (iVar8 == 0) {
    name_06.super_string_view._M_str = "EXPORT";
    name_06.super_string_view._M_len = 6;
    cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_100._M_local_buf,name_06,0);
  }
  else {
    local_528._8_8_ = 0;
    local_528._M_unused._M_member_pointer = 0x20;
    local_518._8_8_ =
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
         ::_M_invoke;
    local_518._0_8_ =
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
         ::_M_manager;
    name_02._M_str = "TARGETS";
    name_02._M_len = 7;
    ArgumentParser::Base::Bind((Base *)&local_100,name_02,(KeywordAction *)&local_528);
    if ((code *)local_518._0_8_ != (code *)0x0) {
      (*(code *)local_518._0_8_)(&local_528,&local_528,3);
    }
    name_03.super_string_view._M_str = "ANDROID_MK";
    name_03.super_string_view._M_len = 10;
    cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_100._M_local_buf,name_03,0x80);
    name_04.super_string_view._M_str = "APPEND";
    name_04.super_string_view._M_len = 6;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&local_100,name_04,0xc0);
    name_05.super_string_view._M_str = "EXPORT_LINK_INTERFACE_LIBRARIES";
    name_05.super_string_view._M_len = 0x1f;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&local_100,name_05,0xc1);
  }
  local_518._0_8_ = &local_2b8;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298._0_8_ = local_298 + 0x10;
  local_298._8_8_ = 0;
  local_298[0x10] = '\0';
  local_260 = false;
  local_258._M_p = (pointer)&local_248;
  local_250 = 0;
  local_248._M_local_buf[0] = '\0';
  local_238._0_8_ = local_238 + 0x10;
  local_238._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_228._M_local_buf[0] = '\0';
  local_218._M_p = (pointer)&local_208;
  local_210 = (cmGlobalGenerator *)0x0;
  local_208._M_local_buf[0] = '\0';
  local_1f8._M_p = (pointer)&local_1e8;
  local_1f0 = 0;
  local_1e8._M_local_buf[0] = '\0';
  local_1d8 = 0;
  local_528._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_518._8_8_ = local_298;
  local_508[0] = 0;
  local_508[1] = 0;
  pcStack_500 = (code *)0x0;
  local_4f8 = 0;
  uStack_4f0 = 0;
  local_4e8._0_8_ = 0;
  local_4e8._8_8_ = 0;
  local_4d8 = (code *)0x0;
  vStack_4d0.
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_4d0.
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)vStack_4d0.
                        super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_528._M_unused._M_object = &local_100;
  ArgumentParser::Instance::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Instance *)&local_528,args,0);
  if (local_4d8 != (code *)0x0) {
    (*local_4d8)(&local_4e8,&local_4e8,__destroy_functor);
  }
  pcVar19 = local_210;
  if (local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e8,
                   "Unknown argument: \"",
                   local_2b8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    puVar11 = (undefined8 *)std::__cxx11::string::append(local_5e8);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 == paVar17) {
      local_518._0_8_ = paVar17->_M_allocated_capacity;
      local_518._8_8_ = puVar11[3];
      local_528._M_unused._M_object =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_518;
    }
    else {
      local_518._0_8_ = paVar17->_M_allocated_capacity;
      local_528._M_unused._M_object =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar11;
    }
    local_528._8_8_ = puVar11[1];
    *puVar11 = paVar17;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._M_unused._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518) {
      operator_delete(local_528._M_unused._M_object,(ulong)(local_518._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_5e8 + 0x10)) {
      operator_delete((void *)local_5e8._0_8_,CONCAT71(local_5e8._17_7_,local_5e8[0x10]) + 1);
    }
    bVar6 = false;
    goto LAB_0034a559;
  }
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  local_5b0._M_string_length = 0;
  local_5b0.field_2._M_local_buf[0] = '\0';
  if (local_210 != (cmGlobalGenerator *)0x0) {
    std::__cxx11::string::_M_assign((string *)&local_5b0);
  }
  if (local_5b0._M_string_length == 0 &&
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._8_8_ ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    iVar8 = std::__cxx11::string::compare
                      ((char *)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (iVar8 == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_528
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298
                     ,".cmake");
      std::__cxx11::string::operator=((string *)&local_5b0,(string *)local_528._M_pod_data);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._M_unused._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518) {
        operator_delete(local_528._M_unused._M_object,(ulong)(local_518._0_8_ + 1));
      }
      goto LAB_00349d06;
    }
    local_528._M_unused._M_object =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_518;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_528,"FILE <filename> option missing.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._M_unused._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518) {
      operator_delete(local_528._M_unused._M_object,(ulong)(local_518._0_8_ + 1));
    }
LAB_00349ddc:
    bVar6 = false;
  }
  else {
    if (local_5b0._M_string_length == 0) {
      cmsys::SystemTools::GetFilenameLastExtension((string *)&local_528,(string *)local_238);
      iVar8 = std::__cxx11::string::compare(local_528._M_pod_data);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._M_unused._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518) {
        operator_delete(local_528._M_unused._M_object,(ulong)(local_518._0_8_ + 1));
      }
      if (iVar8 == 0) {
        std::__cxx11::string::_M_assign((string *)&local_5b0);
        goto LAB_00349d06;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528._M_pod_data);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_528,"FILE option given filename \"",0x1c);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_528,(char *)local_238._0_8_,local_238._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,"\" which does not have an extension of \".cmake\".\n",0x30);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00349da0:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_5e8 + 0x10)) {
        operator_delete((void *)local_5e8._0_8_,CONCAT71(local_5e8._17_7_,local_5e8[0x10]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528._M_pod_data);
      std::ios_base::~ios_base(local_4b8);
      goto LAB_00349ddc;
    }
LAB_00349d06:
    pcVar2 = status->Makefile;
    bVar6 = cmsys::SystemTools::FileIsFullPath(&local_5b0);
    if (bVar6) {
      bVar6 = cmMakefile::CanIWriteThisFile(pcVar2,&local_5b0);
      if (!bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528._M_pod_data);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_528,"FILE option given filename \"",0x1c);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_528,local_5b0._M_dataplus._M_p,
                             local_5b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,"\" which is in the source tree.\n",0x1f);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_00349da0;
      }
    }
    else {
      psVar13 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar2);
      local_5e8._0_8_ = local_5e8 + 0x10;
      pcVar3 = (psVar13->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_5e8,pcVar3,pcVar3 + psVar13->_M_string_length);
      std::__cxx11::string::append(local_5e8);
      local_5b8 = pcVar19;
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append(local_5e8,(ulong)local_5b0._M_dataplus._M_p);
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 == paVar17) {
        local_518._0_8_ = paVar17->_M_allocated_capacity;
        local_518._8_8_ = puVar11[3];
        local_528._M_unused._M_object =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_518;
      }
      else {
        local_518._0_8_ = paVar17->_M_allocated_capacity;
        local_528._M_unused._M_object =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar11;
      }
      local_528._8_8_ = puVar11[1];
      *puVar11 = paVar17;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_5b0,(string *)local_528._M_pod_data);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._M_unused._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518) {
        operator_delete(local_528._M_unused._M_object,(ulong)(local_518._0_8_ + 1));
      }
      pcVar19 = local_5b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_5e8 + 0x10)) {
        operator_delete((void *)local_5e8._0_8_,CONCAT71(local_5e8._17_7_,local_5e8[0x10]) + 1);
      }
    }
    local_548.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_548.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_548.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_5b8 = cmMakefile::GetGlobalGenerator(pcVar2);
    iVar8 = std::__cxx11::string::compare
                      ((char *)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    pcVar4 = local_5b8;
    if (iVar8 == 0) {
      iVar15 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
                       *)&local_5b8->ExportSets,(key_type *)local_298);
      p_Var21 = &(pcVar4->ExportSets).
                 super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
                 ._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)iVar15._M_node == p_Var21) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528._M_pod_data);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_528,"Export set \"",0xc);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_528,(char *)local_298._0_8_,local_298._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" not found.",0xc);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_5e8 + 0x10)) {
          operator_delete((void *)local_5e8._0_8_,CONCAT71(local_5e8._17_7_,local_5e8[0x10]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528._M_pod_data);
        std::ios_base::~ios_base(local_4b8);
        exportSet = (cmExportSet *)0x0;
      }
      else {
        exportSet = (cmExportSet *)(iVar15._M_node + 2);
      }
      if ((_Rb_tree_header *)iVar15._M_node == p_Var21) goto LAB_0034a52e;
LAB_0034a141:
      pcVar14 = cmGlobalGenerator::GetExportedTargetsFile(local_5b8,&local_5b0);
      if ((pcVar14 != (cmExportBuildFileGenerator *)0x0) &&
         (PVar10 = cmMakefile::GetPolicyStatus(pcVar2,CMP0103,false), PVar10 != OLD)) {
        if (PVar10 != WARN) {
          local_528._M_unused._M_member_pointer = 0x29;
          local_528._8_8_ = (long)"export() command already specified for the file\n  " + 9;
          local_5e8._0_8_ = local_238._8_8_;
          local_5e8._8_8_ = local_238._0_8_;
          cmStrCat<char[32]>(&local_590,(cmAlphaNum *)&local_528,(cmAlphaNum *)local_5e8,
                             (char (*) [32])"\nDid you miss \'APPEND\' keyword?");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_590._M_dataplus._M_p != &local_590.field_2) {
            pvVar18 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT71(local_590.field_2._M_allocated_capacity._1_7_,
                                  local_590.field_2._M_local_buf[0]);
            goto LAB_0034a070;
          }
          goto LAB_0034a52e;
        }
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_568,(cmPolicies *)0x67,id);
        local_528._M_unused._M_object = (void *)local_568._M_string_length;
        local_528._8_8_ = local_568._M_dataplus._M_p;
        local_5e8._8_8_ = local_5e8 + 0x10;
        local_5e8._0_8_ = &DAT_00000001;
        local_5e8[0x10] = '\n';
        cmStrCat<char[51],std::__cxx11::string,char[32]>
                  (&local_590,(cmAlphaNum *)&local_528,(cmAlphaNum *)local_5e8,
                   (char (*) [51])"export() command already specified for the file\n  ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                   (char (*) [32])"\nDid you miss \'APPEND\' keyword?");
        cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&local_590);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_590._M_dataplus._M_p != &local_590.field_2) {
          operator_delete(local_590._M_dataplus._M_p,
                          CONCAT71(local_590.field_2._M_allocated_capacity._1_7_,
                                   local_590.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != &local_568.field_2) {
          operator_delete(local_568._M_dataplus._M_p,local_568.field_2._0_8_ + 1);
        }
      }
      if (pcVar19 == (cmGlobalGenerator *)0x0) {
        std::make_unique<cmExportBuildFileGenerator>();
      }
      else {
        std::make_unique<cmExportBuildAndroidMKGenerator>();
      }
      uVar22 = local_528._M_unused._0_8_;
      cmExportFileGenerator::SetExportFile
                ((cmExportFileGenerator *)local_528._M_unused._0_8_,local_5b0._M_dataplus._M_p);
      std::__cxx11::string::_M_assign((string *)(uVar22 + 8));
      local_120[0] = local_110;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_120,local_1f8._M_p,local_1f8._M_p + local_1f0);
      std::__cxx11::string::operator=((string *)(uVar22 + 0x158),(string *)local_120);
      if (local_120[0] != local_110) {
        operator_delete(local_120[0],local_110[0] + 1);
      }
      *(code *)(uVar22 + 200) = local_1d8._0_1_;
      if (exportSet == (cmExportSet *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(uVar22 + 0x118),&local_548);
      }
      else {
        cmExportBuildFileGenerator::SetExportSet((cmExportBuildFileGenerator *)uVar22,exportSet);
      }
      *(code *)(uVar22 + 0x28) = local_1d8._1_1_;
      cmMakefile::GetGeneratorConfigs_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_528,pcVar2,IncludeEmptyConfig);
      uVar5 = local_528._8_8_;
      for (config = local_528._M_unused._0_8_; config != uVar5; config = config + 0x20) {
        cmExportFileGenerator::AddConfiguration((cmExportFileGenerator *)uVar22,(string *)config);
      }
      if (exportSet == (cmExportSet *)0x0) {
        cmGlobalGenerator::AddBuildExportSet(local_5b8,(cmExportBuildFileGenerator *)uVar22);
      }
      else {
        cmGlobalGenerator::AddBuildExportExportSet(local_5b8,(cmExportBuildFileGenerator *)uVar22);
      }
      local_570._M_p = (pointer)uVar22;
      cmMakefile::AddExportBuildFileGenerator
                (pcVar2,(unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                         *)&local_570);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_570._M_p + 8))();
      }
      local_570._M_p = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_528);
      bVar6 = true;
    }
    else if (local_260 == true) {
      if (local_278._M_value.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_278._M_value.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar22 = local_278._M_value.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          bVar6 = cmMakefile::IsAlias(pcVar2,(string *)uVar22);
          if (bVar6) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528._M_pod_data);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_528,"given ALIAS target \"",0x14);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_528,(((string *)uVar22)->_M_dataplus)._M_p,
                                 ((string *)uVar22)->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"\" which may not be exported.",0x1c);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0034a4f2:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5e8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_5e8 + 0x10)) {
              operator_delete((void *)local_5e8._0_8_,CONCAT71(local_5e8._17_7_,local_5e8[0x10]) + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528._M_pod_data);
            std::ios_base::~ios_base(local_4b8);
            goto LAB_0034a52e;
          }
          this = cmGlobalGenerator::FindTarget(local_5b8,(string *)uVar22,false);
          if (this == (cmTarget *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528._M_pod_data);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_528,"given target \"",0xe);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_528,(((string *)uVar22)->_M_dataplus)._M_p,
                                 ((string *)uVar22)->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"\" which is not built by this project.",0x25);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_0034a4f2;
          }
          TVar9 = cmTarget::GetType(this);
          if (TVar9 == UTILITY) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_5e8,"given custom target \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           uVar22);
            puVar11 = (undefined8 *)std::__cxx11::string::append(local_5e8);
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar17) {
              local_518._0_8_ = paVar17->_M_allocated_capacity;
              local_518._8_8_ = puVar11[3];
              local_528._M_unused._M_object =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_518;
            }
            else {
              local_518._0_8_ = paVar17->_M_allocated_capacity;
              local_528._M_unused._M_object =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar11;
            }
            local_528._8_8_ = puVar11[1];
            *puVar11 = paVar17;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            std::__cxx11::string::_M_assign((string *)&status->Error);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._M_unused._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_518) {
              operator_delete(local_528._M_unused._M_object,(ulong)(local_518._0_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5e8._0_8_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_5e8 + 0x10)) goto LAB_0034a52e;
            pvVar18 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT71(local_5e8._17_7_,local_5e8[0x10]);
            local_590._M_dataplus._M_p = (pointer)local_5e8._0_8_;
            goto LAB_0034a070;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_548,(value_type *)uVar22);
          uVar22 = uVar22 + 0x20;
        } while ((pointer)uVar22 !=
                 local_278._M_value.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if ((local_1d8._0_1_ != (code)0x1) ||
         (pcVar14 = cmGlobalGenerator::GetExportedTargetsFile(local_5b8,&local_5b0),
         pcVar14 == (cmExportBuildFileGenerator *)0x0)) {
        exportSet = (cmExportSet *)0x0;
        goto LAB_0034a141;
      }
      bVar6 = true;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &pcVar14->Targets,
                 (pcVar14->Targets).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 local_548.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_548.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    else {
      local_528._M_unused._M_object =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_518;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_528,"EXPORT or TARGETS specifier missing.","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      pvVar18 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_518._0_8_;
      local_590._M_dataplus._M_p = (pointer)local_528._M_unused._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._M_unused._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518) {
LAB_0034a070:
        operator_delete(local_590._M_dataplus._M_p,
                        (ulong)((long)&(pvVar18->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
LAB_0034a52e:
      bVar6 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_548);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,
                    CONCAT71(local_5b0.field_2._M_allocated_capacity._1_7_,
                             local_5b0.field_2._M_local_buf[0]) + 1);
  }
LAB_0034a559:
  cmExportCommand::Arguments::~Arguments((Arguments *)local_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b8);
  std::
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::~vector(local_a8);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  if (local_d8 != (code *)0x0) {
    (*local_d8)((_Any_data *)&local_e8,(_Any_data *)&local_e8,__destroy_functor);
  }
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             *)&local_100);
  return bVar6;
}

Assistant:

bool cmExportCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with too few arguments");
    return false;
  }

  if (args[0] == "PACKAGE") {
    return HandlePackage(args, status);
  }

  struct Arguments
  {
    std::string ExportSetName;
    cm::optional<ArgumentParser::MaybeEmpty<std::vector<std::string>>> Targets;
    std::string Namespace;
    std::string Filename;
    std::string AndroidMKFile;
    std::string CxxModulesDirectory;
    bool Append = false;
    bool ExportOld = false;
  };

  auto parser = cmArgumentParser<Arguments>{}
                  .Bind("NAMESPACE"_s, &Arguments::Namespace)
                  .Bind("FILE"_s, &Arguments::Filename);

  bool const supportCxx20FileSetTypes = cmExperimental::HasSupportEnabled(
    status.GetMakefile(), cmExperimental::Feature::CxxModuleCMakeApi);
  if (supportCxx20FileSetTypes) {
    parser.Bind("CXX_MODULES_DIRECTORY"_s, &Arguments::CxxModulesDirectory);
  }

  if (args[0] == "EXPORT") {
    parser.Bind("EXPORT"_s, &Arguments::ExportSetName);
  } else {
    parser.Bind("TARGETS"_s, &Arguments::Targets);
    parser.Bind("ANDROID_MK"_s, &Arguments::AndroidMKFile);
    parser.Bind("APPEND"_s, &Arguments::Append);
    parser.Bind("EXPORT_LINK_INTERFACE_LIBRARIES"_s, &Arguments::ExportOld);
  }

  std::vector<std::string> unknownArgs;
  Arguments const arguments = parser.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    status.SetError("Unknown argument: \"" + unknownArgs.front() + "\".");
    return false;
  }

  std::string fname;
  bool android = false;
  if (!arguments.AndroidMKFile.empty()) {
    fname = arguments.AndroidMKFile;
    android = true;
  }
  if (arguments.Filename.empty() && fname.empty()) {
    if (args[0] != "EXPORT") {
      status.SetError("FILE <filename> option missing.");
      return false;
    }
    fname = arguments.ExportSetName + ".cmake";
  } else if (fname.empty()) {
    // Make sure the file has a .cmake extension.
    if (cmSystemTools::GetFilenameLastExtension(arguments.Filename) !=
        ".cmake") {
      std::ostringstream e;
      e << "FILE option given filename \"" << arguments.Filename
        << "\" which does not have an extension of \".cmake\".\n";
      status.SetError(e.str());
      return false;
    }
    fname = arguments.Filename;
  }

  cmMakefile& mf = status.GetMakefile();

  // Get the file to write.
  if (cmSystemTools::FileIsFullPath(fname)) {
    if (!mf.CanIWriteThisFile(fname)) {
      std::ostringstream e;
      e << "FILE option given filename \"" << fname
        << "\" which is in the source tree.\n";
      status.SetError(e.str());
      return false;
    }
  } else {
    // Interpret relative paths with respect to the current build dir.
    std::string const& dir = mf.GetCurrentBinaryDirectory();
    fname = dir + "/" + fname;
  }

  std::vector<std::string> targets;

  cmGlobalGenerator* gg = mf.GetGlobalGenerator();

  cmExportSet* exportSet = nullptr;
  if (args[0] == "EXPORT") {
    cmExportSetMap& setMap = gg->GetExportSets();
    auto const it = setMap.find(arguments.ExportSetName);
    if (it == setMap.end()) {
      std::ostringstream e;
      e << "Export set \"" << arguments.ExportSetName << "\" not found.";
      status.SetError(e.str());
      return false;
    }
    exportSet = &it->second;
  } else if (arguments.Targets) {
    for (std::string const& currentTarget : *arguments.Targets) {
      if (mf.IsAlias(currentTarget)) {
        std::ostringstream e;
        e << "given ALIAS target \"" << currentTarget
          << "\" which may not be exported.";
        status.SetError(e.str());
        return false;
      }

      if (cmTarget* target = gg->FindTarget(currentTarget)) {
        if (target->GetType() == cmStateEnums::UTILITY) {
          status.SetError("given custom target \"" + currentTarget +
                          "\" which may not be exported.");
          return false;
        }
      } else {
        std::ostringstream e;
        e << "given target \"" << currentTarget
          << "\" which is not built by this project.";
        status.SetError(e.str());
        return false;
      }
      targets.push_back(currentTarget);
    }
    if (arguments.Append) {
      if (cmExportBuildFileGenerator* ebfg =
            gg->GetExportedTargetsFile(fname)) {
        ebfg->AppendTargets(targets);
        return true;
      }
    }
  } else {
    status.SetError("EXPORT or TARGETS specifier missing.");
    return false;
  }

  // if cmExportBuildFileGenerator is already defined for the file
  // and APPEND is not specified, if CMP0103 is OLD ignore previous definition
  // else raise an error
  if (gg->GetExportedTargetsFile(fname) != nullptr) {
    switch (mf.GetPolicyStatus(cmPolicies::CMP0103)) {
      case cmPolicies::WARN:
        mf.IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0103), '\n',
                   "export() command already specified for the file\n  ",
                   arguments.Filename, "\nDid you miss 'APPEND' keyword?"));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      default:
        status.SetError(cmStrCat("command already specified for the file\n  ",
                                 arguments.Filename,
                                 "\nDid you miss 'APPEND' keyword?"));
        return false;
    }
  }

  // Setup export file generation.
  std::unique_ptr<cmExportBuildFileGenerator> ebfg = nullptr;
  if (android) {
    ebfg = cm::make_unique<cmExportBuildAndroidMKGenerator>();
  } else {
    ebfg = cm::make_unique<cmExportBuildFileGenerator>();
  }
  ebfg->SetExportFile(fname.c_str());
  ebfg->SetNamespace(arguments.Namespace);
  ebfg->SetCxxModuleDirectory(arguments.CxxModulesDirectory);
  ebfg->SetAppendMode(arguments.Append);
  if (exportSet != nullptr) {
    ebfg->SetExportSet(exportSet);
  } else {
    ebfg->SetTargets(targets);
  }
  ebfg->SetExportOld(arguments.ExportOld);

  // Compute the set of configurations exported.
  std::vector<std::string> configurationTypes =
    mf.GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  for (std::string const& ct : configurationTypes) {
    ebfg->AddConfiguration(ct);
  }
  if (exportSet != nullptr) {
    gg->AddBuildExportExportSet(ebfg.get());
  } else {
    gg->AddBuildExportSet(ebfg.get());
  }
  mf.AddExportBuildFileGenerator(std::move(ebfg));

  return true;
}